

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int wally_tx_get_weight(wally_tx *tx,size_t *written)

{
  int iVar1;
  int iVar2;
  size_t is_elements;
  size_t witness_count;
  size_t witness_size;
  size_t base_size;
  
  is_elements = 0;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar1 = wally_tx_is_elements(tx,&is_elements);
  iVar2 = -2;
  if ((written != (size_t *)0x0) && (iVar1 == 0)) {
    iVar1 = tx_get_lengths(tx,(tx_serialize_opts *)0x0,1,&base_size,&witness_size,&witness_count,
                           is_elements != 0);
    if (iVar1 == 0) {
      if (witness_count != 0) {
        witness_count = witness_size;
      }
      *written = witness_count + base_size * 4;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int wally_tx_get_weight(const struct wally_tx *tx, size_t *written)
{
    size_t base_size, witness_size, witness_count;
    size_t is_elements = 0;

    if (written)
        *written = 0;

#ifdef BUILD_ELEMENTS
    if (wally_tx_is_elements(tx, &is_elements) != WALLY_OK)
        return WALLY_EINVAL;
#endif

    if (!written ||
        tx_get_lengths(tx, NULL, WALLY_TX_FLAG_USE_WITNESS, &base_size,
                       &witness_size, &witness_count, is_elements != 0) != WALLY_OK)
        return WALLY_EINVAL;

    if (witness_count)
        *written = base_size * 4 + witness_size;
    else
        *written = base_size * 4;

    return WALLY_OK;
}